

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

void Abc_NtkDress2(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConflictLimit,int fVerbose)

{
  int nNodes0;
  int nNodes1;
  abctime aVar1;
  Vec_Ptr_t *vRes_00;
  abctime aVar2;
  abctime clk;
  Vec_Ptr_t *vRes;
  int fVerbose_local;
  int nConflictLimit_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  aVar1 = Abc_Clock();
  vRes_00 = Abc_NtkDressComputeEquivs(pNtk1,pNtk2,nConflictLimit,fVerbose);
  nNodes0 = Abc_NtkNodeNum(pNtk1);
  nNodes1 = Abc_NtkNodeNum(pNtk1);
  aVar2 = Abc_Clock();
  Abc_NtkDressPrintStats(vRes_00,nNodes0,nNodes1,aVar2 - aVar1);
  Abc_NtkDress2Transfer(pNtk1,pNtk2,vRes_00,fVerbose);
  Vec_VecFree((Vec_Vec_t *)vRes_00);
  return;
}

Assistant:

void Abc_NtkDress2( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConflictLimit, int fVerbose )
{
    Vec_Ptr_t * vRes;
    abctime clk = Abc_Clock();
    vRes = Abc_NtkDressComputeEquivs( pNtk1, pNtk2, nConflictLimit, fVerbose );
//    Abc_NtkDressPrintEquivs( vRes );
    Abc_NtkDressPrintStats( vRes, Abc_NtkNodeNum(pNtk1), Abc_NtkNodeNum(pNtk1), Abc_Clock() - clk );
    Abc_NtkDress2Transfer( pNtk1, pNtk2, vRes, fVerbose );
    Vec_VecFree( (Vec_Vec_t *)vRes );
}